

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationDataBuilder::addCE32
          (CollationDataBuilder *this,uint32_t ce32,UErrorCode *errorCode)

{
  int32_t *piVar1;
  int iVar2;
  UBool UVar3;
  long lVar4;
  
  iVar2 = (this->ce32s).count;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      if ((this->ce32s).elements[lVar4] == ce32) {
        return (int32_t)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  if (((iVar2 < -1) || ((this->ce32s).capacity <= iVar2)) &&
     (UVar3 = UVector32::expandCapacity(&this->ce32s,iVar2 + 1,errorCode), UVar3 == '\0')) {
    return iVar2;
  }
  (this->ce32s).elements[(this->ce32s).count] = ce32;
  piVar1 = &(this->ce32s).count;
  *piVar1 = *piVar1 + 1;
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::addCE32(uint32_t ce32, UErrorCode &errorCode) {
    int32_t length = ce32s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce32 == (uint32_t)ce32s.elementAti(i)) { return i; }
    }
    ce32s.addElement((int32_t)ce32, errorCode);  
    return length;
}